

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O0

int elf_zstd_make_literal_baseline_fse
              (elf_zstd_fse_entry *fse_table,int table_bits,
              elf_zstd_fse_baseline_entry *baseline_table)

{
  byte bVar1;
  uchar uVar2;
  uint16_t uVar3;
  uint uVar4;
  elf_zstd_fse_baseline_entry *peVar5;
  uint32_t basebits;
  uint idx;
  uint16_t base;
  uchar bits;
  uchar symbol;
  elf_zstd_fse_baseline_entry *pbaseline;
  elf_zstd_fse_entry *pfse;
  size_t count;
  elf_zstd_fse_baseline_entry *baseline_table_local;
  int table_bits_local;
  elf_zstd_fse_entry *fse_table_local;
  
  uVar4 = 1 << ((byte)table_bits & 0x1f);
  _idx = baseline_table + uVar4;
  pbaseline = (elf_zstd_fse_baseline_entry *)(fse_table + uVar4);
  do {
    if (pbaseline <= fse_table) {
      return 1;
    }
    peVar5 = _idx + -1;
    bVar1 = pbaseline[-1].basebits;
    uVar2 = pbaseline[-1].bits;
    uVar3 = pbaseline[-1].base;
    if (bVar1 < 0x10) {
      peVar5->baseline = (uint)bVar1;
      _idx[-1].basebits = '\0';
    }
    else {
      if (0x23 < bVar1) {
        elf_uncompress_failed();
        return 0;
      }
      uVar4 = elf_zstd_literal_length_base[bVar1 - 0x10];
      peVar5->baseline = uVar4 & 0xffffff;
      _idx[-1].basebits = (uchar)(uVar4 >> 0x18);
    }
    _idx[-1].bits = uVar2;
    _idx[-1].base = uVar3;
    _idx = peVar5;
    pbaseline = (elf_zstd_fse_baseline_entry *)&pbaseline[-1].basebits;
  } while( true );
}

Assistant:

static int
elf_zstd_make_literal_baseline_fse (
    const struct elf_zstd_fse_entry *fse_table,
    int table_bits,
    struct elf_zstd_fse_baseline_entry *baseline_table)
{
  size_t count;
  const struct elf_zstd_fse_entry *pfse;
  struct elf_zstd_fse_baseline_entry *pbaseline;

  /* Convert backward to avoid overlap.  */

  count = 1U << table_bits;
  pfse = fse_table + count;
  pbaseline = baseline_table + count;
  while (pfse > fse_table)
    {
      unsigned char symbol;
      unsigned char bits;
      uint16_t base;

      --pfse;
      --pbaseline;
      symbol = pfse->symbol;
      bits = pfse->bits;
      base = pfse->base;
      if (symbol < ZSTD_LITERAL_LENGTH_BASELINE_OFFSET)
	{
	  pbaseline->baseline = (uint32_t)symbol;
	  pbaseline->basebits = 0;
	}
      else
	{
	  unsigned int idx;
	  uint32_t basebits;

	  if (unlikely (symbol > 35))
	    {
	      elf_uncompress_failed ();
	      return 0;
	    }
	  idx = symbol - ZSTD_LITERAL_LENGTH_BASELINE_OFFSET;
	  basebits = elf_zstd_literal_length_base[idx];
	  pbaseline->baseline = ZSTD_DECODE_BASELINE(basebits);
	  pbaseline->basebits = ZSTD_DECODE_BASEBITS(basebits);
	}
      pbaseline->bits = bits;
      pbaseline->base = base;
    }

  return 1;
}